

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::ProcessDirectiveTocTree(cmRST *this)

{
  long lVar1;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (__lhs = (this->MarkupLines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != (this->MarkupLines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    if (__lhs->_M_string_length != 0) {
      lVar1 = std::__cxx11::string::find_first_of((char *)__lhs,0x1ccdc1);
      if (lVar1 == -1) {
        std::operator+(&local_50,__lhs,".rst");
        ProcessInclude(this,&local_50,IncludeTocTree);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void cmRST::ProcessDirectiveTocTree()
{
  // Process documents referenced by toctree directive.
  for(std::vector<std::string>::iterator i = this->MarkupLines.begin();
      i != this->MarkupLines.end(); ++i)
    {
    if(!i->empty() && i->find_first_of(":") == i->npos)
      {
      this->ProcessInclude(*i + ".rst", IncludeTocTree);
      }
    }
}